

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::FileGenerator::GenerateSiblings
          (FileGenerator *this,string *package_dir,GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *annotation_list)

{
  bool bVar1;
  Context *pCVar2;
  long lVar3;
  GeneratorFactory *pGVar4;
  int iVar5;
  long *plVar6;
  undefined4 extraout_var;
  ZeroCopyOutputStream *pZVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *psVar9;
  FileDescriptor *pFVar10;
  undefined4 extraout_var_03;
  long *plVar11;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  pointer pbVar12;
  size_type *psVar13;
  _func_int **pp_Var14;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *pAVar15;
  char *__function;
  long lVar16;
  long lVar17;
  string filename;
  string info_full_path;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector_2;
  undefined1 local_180;
  undefined7 uStack_17f;
  GeneratedCodeInfo annotations;
  undefined1 local_120 [24];
  long lStack_108;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  EnumLiteGenerator generator;
  ZeroCopyOutputStream *pZVar7;
  undefined4 extraout_var_00;
  
  pFVar10 = this->file_;
  if (*(char *)(*(long *)(pFVar10 + 0xa0) + 0xa0) == '\x01') {
    if (0 < *(int *)(pFVar10 + 0x68)) {
      lVar17 = 0;
      lVar16 = 0;
      do {
        pCVar2 = (this->context_).ptr_;
        if (pCVar2 == (Context *)0x0) goto LAB_0026bebc;
        if (((pCVar2->options_).enforce_lite == false) &&
           (*(int *)(*(long *)(pFVar10 + 0xa0) + 0xa8) != 3)) {
          EnumGenerator::EnumGenerator
                    ((EnumGenerator *)&generator,
                     (EnumDescriptor *)(*(long *)(pFVar10 + 0x70) + lVar17),this->immutable_api_,
                     pCVar2);
          lVar3 = *(long *)(this->file_ + 0x70);
          bVar1 = (this->options_).annotate_code;
          annotation_collector_2.annotation_proto_ = (GeneratedCodeInfo *)0x0;
          local_180 = 0;
          annotation_collector_2.super_AnnotationCollector._vptr_AnnotationCollector =
               (_func_int **)&local_180;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &annotations,package_dir,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (lVar3 + lVar17));
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&annotations,
                                      (ulong)annotation_collector_2.super_AnnotationCollector.
                                             _vptr_AnnotationCollector);
          local_120._0_8_ = local_120 + 0x10;
          pbVar12 = (pointer)(plVar6 + 2);
          if ((pointer)*plVar6 == pbVar12) {
            local_120._16_8_ = (pbVar12->_M_dataplus)._M_p;
            lStack_108 = plVar6[3];
          }
          else {
            local_120._16_8_ = (pbVar12->_M_dataplus)._M_p;
            local_120._0_8_ = (pointer)*plVar6;
          }
          local_120._8_8_ = plVar6[1];
          *plVar6 = (long)pbVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append(local_120);
          psVar13 = (size_type *)(plVar6 + 2);
          if ((size_type *)*plVar6 == psVar13) {
            filename.field_2._M_allocated_capacity = *psVar13;
            filename.field_2._8_8_ = plVar6[3];
            filename._M_dataplus._M_p = (pointer)&filename.field_2;
          }
          else {
            filename.field_2._M_allocated_capacity = *psVar13;
            filename._M_dataplus._M_p = (pointer)*plVar6;
          }
          filename._M_string_length = plVar6[1];
          *plVar6 = (long)psVar13;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((pointer)local_120._0_8_ != (pointer)(local_120 + 0x10)) {
            operator_delete((void *)local_120._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_120._16_8_)->_M_p + 1));
          }
          if (annotations.super_Message.super_MessageLite._vptr_MessageLite !=
              (MessageLite)&annotations._has_bits_) {
            operator_delete((void *)annotations.super_Message.super_MessageLite._vptr_MessageLite,
                            annotations._16_8_ + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(file_list,&filename);
          info_full_path._M_dataplus._M_p = (pointer)&info_full_path.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&info_full_path,filename._M_dataplus._M_p,
                     filename._M_dataplus._M_p + filename._M_string_length);
          std::__cxx11::string::append((char *)&info_full_path);
          GeneratedCodeInfo::GeneratedCodeInfo(&annotations);
          annotation_collector.super_AnnotationCollector._vptr_AnnotationCollector =
               (_func_int **)&PTR_AddAnnotation_0041fe08;
          annotation_collector.annotation_proto_ = &annotations;
          iVar5 = (*context->_vptr_GeneratorContext[2])(context,&filename);
          pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar5);
          pAVar15 = (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)0x0;
          if (bVar1 != false) {
            pAVar15 = &annotation_collector;
          }
          io::Printer::Printer((Printer *)local_120,pZVar7,'$',&pAVar15->super_AnnotationCollector);
          io::Printer::Print((Printer *)local_120,
                             "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                             ,"filename",(string *)**(undefined8 **)(lVar3 + 0x10 + lVar17));
          if ((this->java_package_)._M_string_length != 0) {
            io::Printer::Print((Printer *)local_120,"package $package$;\n\n","package",
                               &this->java_package_);
          }
          EnumGenerator::Generate((EnumGenerator *)&generator,(Printer *)local_120);
          if (bVar1 != false) {
            iVar5 = (*context->_vptr_GeneratorContext[2])(context,&info_full_path);
            pZVar8 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar5);
            MessageLite::SerializeToZeroCopyStream((MessageLite *)&annotations,pZVar8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(annotation_list,&info_full_path);
            if (pZVar8 != (ZeroCopyOutputStream *)0x0) {
              (*pZVar8->_vptr_ZeroCopyOutputStream[1])(pZVar8);
            }
          }
          io::Printer::~Printer((Printer *)local_120);
          if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
          }
          GeneratedCodeInfo::~GeneratedCodeInfo(&annotations);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)info_full_path._M_dataplus._M_p != &info_full_path.field_2) {
            operator_delete(info_full_path._M_dataplus._M_p,
                            CONCAT71(info_full_path.field_2._M_allocated_capacity._1_7_,
                                     info_full_path.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)filename._M_dataplus._M_p != &filename.field_2) {
            operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
          }
          if (annotation_collector_2.super_AnnotationCollector._vptr_AnnotationCollector !=
              (_func_int **)&local_180) {
            operator_delete(annotation_collector_2.super_AnnotationCollector.
                            _vptr_AnnotationCollector,CONCAT71(uStack_17f,local_180) + 1);
          }
          EnumGenerator::~EnumGenerator((EnumGenerator *)&generator);
        }
        else {
          EnumLiteGenerator::EnumLiteGenerator
                    (&generator,(EnumDescriptor *)(*(long *)(pFVar10 + 0x70) + lVar17),
                     this->immutable_api_,pCVar2);
          lVar3 = *(long *)(this->file_ + 0x70);
          bVar1 = (this->options_).annotate_code;
          annotation_collector_2.annotation_proto_ = (GeneratedCodeInfo *)0x0;
          local_180 = 0;
          annotation_collector_2.super_AnnotationCollector._vptr_AnnotationCollector =
               (_func_int **)&local_180;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &annotations,package_dir,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (lVar3 + lVar17));
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&annotations,
                                      (ulong)annotation_collector_2.super_AnnotationCollector.
                                             _vptr_AnnotationCollector);
          local_120._0_8_ = local_120 + 0x10;
          pbVar12 = (pointer)(plVar6 + 2);
          if ((pointer)*plVar6 == pbVar12) {
            local_120._16_8_ = (pbVar12->_M_dataplus)._M_p;
            lStack_108 = plVar6[3];
          }
          else {
            local_120._16_8_ = (pbVar12->_M_dataplus)._M_p;
            local_120._0_8_ = (pointer)*plVar6;
          }
          local_120._8_8_ = plVar6[1];
          *plVar6 = (long)pbVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append(local_120);
          psVar13 = (size_type *)(plVar6 + 2);
          if ((size_type *)*plVar6 == psVar13) {
            filename.field_2._M_allocated_capacity = *psVar13;
            filename.field_2._8_8_ = plVar6[3];
            filename._M_dataplus._M_p = (pointer)&filename.field_2;
          }
          else {
            filename.field_2._M_allocated_capacity = *psVar13;
            filename._M_dataplus._M_p = (pointer)*plVar6;
          }
          filename._M_string_length = plVar6[1];
          *plVar6 = (long)psVar13;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((pointer)local_120._0_8_ != (pointer)(local_120 + 0x10)) {
            operator_delete((void *)local_120._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_120._16_8_)->_M_p + 1));
          }
          if (annotations.super_Message.super_MessageLite._vptr_MessageLite !=
              (MessageLite)&annotations._has_bits_) {
            operator_delete((void *)annotations.super_Message.super_MessageLite._vptr_MessageLite,
                            annotations._16_8_ + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(file_list,&filename);
          info_full_path._M_dataplus._M_p = (pointer)&info_full_path.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&info_full_path,filename._M_dataplus._M_p,
                     filename._M_dataplus._M_p + filename._M_string_length);
          std::__cxx11::string::append((char *)&info_full_path);
          GeneratedCodeInfo::GeneratedCodeInfo(&annotations);
          annotation_collector.super_AnnotationCollector._vptr_AnnotationCollector =
               (_func_int **)&PTR_AddAnnotation_0041fe08;
          annotation_collector.annotation_proto_ = &annotations;
          iVar5 = (*context->_vptr_GeneratorContext[2])(context,&filename);
          pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar5);
          pAVar15 = (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)0x0;
          if (bVar1 != false) {
            pAVar15 = &annotation_collector;
          }
          io::Printer::Printer((Printer *)local_120,pZVar7,'$',&pAVar15->super_AnnotationCollector);
          io::Printer::Print((Printer *)local_120,
                             "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                             ,"filename",(string *)**(undefined8 **)(lVar3 + 0x10 + lVar17));
          if ((this->java_package_)._M_string_length != 0) {
            io::Printer::Print((Printer *)local_120,"package $package$;\n\n","package",
                               &this->java_package_);
          }
          EnumLiteGenerator::Generate(&generator,(Printer *)local_120);
          if (bVar1 != false) {
            iVar5 = (*context->_vptr_GeneratorContext[2])(context,&info_full_path);
            pZVar8 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar5);
            MessageLite::SerializeToZeroCopyStream((MessageLite *)&annotations,pZVar8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(annotation_list,&info_full_path);
            if (pZVar8 != (ZeroCopyOutputStream *)0x0) {
              (*pZVar8->_vptr_ZeroCopyOutputStream[1])(pZVar8);
            }
          }
          io::Printer::~Printer((Printer *)local_120);
          if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
          }
          GeneratedCodeInfo::~GeneratedCodeInfo(&annotations);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)info_full_path._M_dataplus._M_p != &info_full_path.field_2) {
            operator_delete(info_full_path._M_dataplus._M_p,
                            CONCAT71(info_full_path.field_2._M_allocated_capacity._1_7_,
                                     info_full_path.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)filename._M_dataplus._M_p != &filename.field_2) {
            operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
          }
          if (annotation_collector_2.super_AnnotationCollector._vptr_AnnotationCollector !=
              (_func_int **)&local_180) {
            operator_delete(annotation_collector_2.super_AnnotationCollector.
                            _vptr_AnnotationCollector,CONCAT71(uStack_17f,local_180) + 1);
          }
          EnumLiteGenerator::~EnumLiteGenerator(&generator);
        }
        lVar16 = lVar16 + 1;
        pFVar10 = this->file_;
        lVar17 = lVar17 + 0x38;
      } while (lVar16 < *(int *)(pFVar10 + 0x68));
    }
    if (0 < *(int *)(pFVar10 + 0x58)) {
      pbVar12 = (pointer)(local_120 + 0x10);
      lVar16 = 0;
      lVar17 = 0;
      do {
        if (this->immutable_api_ == true) {
          bVar1 = (this->options_).annotate_code;
          lVar3 = *(long *)(pFVar10 + 0x60);
          local_120._16_8_ = (pointer)0x65646c697542724f;
          local_120._8_8_ = (pointer)0x9;
          lStack_108 = CONCAT62(lStack_108._2_6_,0x72);
          local_120._0_8_ = pbVar12;
          psVar9 = internal::
                   scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
                   ::operator[](&this->message_generators_,lVar17);
          GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
                    ((java *)package_dir,&this->java_package_,(string *)(lVar3 + lVar16),
                     (Descriptor *)context,(GeneratorContext *)file_list,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(ulong)bVar1,SUB81(annotation_list,0),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_120,(string *)psVar9->ptr_,(MessageGenerator *)0x29,0);
          if ((pointer)local_120._0_8_ != pbVar12) {
            operator_delete((void *)local_120._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_120._16_8_)->_M_p + 1));
          }
          pFVar10 = this->file_;
        }
        bVar1 = (this->options_).annotate_code;
        lVar3 = *(long *)(pFVar10 + 0x60);
        local_120._8_8_ = (pointer)0x0;
        local_120._16_8_ = local_120._16_8_ & 0xffffffffffffff00;
        local_120._0_8_ = pbVar12;
        psVar9 = internal::
                 scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
                 ::operator[](&this->message_generators_,lVar17);
        GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
                  ((java *)package_dir,&this->java_package_,(string *)(lVar3 + lVar16),
                   (Descriptor *)context,(GeneratorContext *)file_list,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(ulong)bVar1,SUB81(annotation_list,0),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_120,(string *)psVar9->ptr_,(MessageGenerator *)0x21,0);
        if ((pointer)local_120._0_8_ != pbVar12) {
          operator_delete((void *)local_120._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_120._16_8_)->_M_p + 1));
        }
        lVar17 = lVar17 + 1;
        pFVar10 = this->file_;
        lVar16 = lVar16 + 0xa8;
      } while (lVar17 < *(int *)(pFVar10 + 0x58));
    }
    pCVar2 = (this->context_).ptr_;
    if (pCVar2 == (Context *)0x0) {
LAB_0026bebc:
      __function = 
      "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::Context>::operator->() const [C = google::protobuf::compiler::java::Context]"
      ;
LAB_0026bed1:
      __assert_fail("ptr_ != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                    ,0x5f,__function);
    }
    if ((((0 < *(int *)(pFVar10 + 0x78)) && ((pCVar2->options_).enforce_lite == false)) &&
        (*(int *)(*(long *)(pFVar10 + 0xa0) + 0xa8) != 3)) &&
       (*(char *)(*(long *)(pFVar10 + 0xa0) + 0xa4) == '\x01')) {
      lVar16 = 0;
      lVar17 = 0;
      do {
        pGVar4 = (this->generator_factory_).ptr_;
        if (pGVar4 == (GeneratorFactory *)0x0) {
          __function = 
          "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::GeneratorFactory>::operator->() const [C = google::protobuf::compiler::java::GeneratorFactory]"
          ;
          goto LAB_0026bed1;
        }
        iVar5 = (*pGVar4->_vptr_GeneratorFactory[4])(pGVar4,*(long *)(pFVar10 + 0x80) + lVar16);
        plVar6 = (long *)CONCAT44(extraout_var_03,iVar5);
        lVar3 = *(long *)(this->file_ + 0x80);
        bVar1 = (this->options_).annotate_code;
        info_full_path._M_dataplus._M_p = (pointer)&info_full_path.field_2;
        info_full_path._M_string_length = 0;
        info_full_path.field_2._M_local_buf[0] = '\0';
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &generator,package_dir,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar3 + lVar16));
        plVar11 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&generator,(ulong)info_full_path._M_dataplus._M_p);
        pbVar12 = (pointer)(plVar11 + 2);
        if ((pointer)*plVar11 == pbVar12) {
          local_120._16_8_ = (pbVar12->_M_dataplus)._M_p;
          lStack_108 = plVar11[3];
          local_120._0_8_ = (pointer)(local_120 + 0x10);
        }
        else {
          local_120._16_8_ = (pbVar12->_M_dataplus)._M_p;
          local_120._0_8_ = (pointer)*plVar11;
        }
        local_120._8_8_ = plVar11[1];
        *plVar11 = (long)pbVar12;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)local_120);
        annotations.super_Message.super_MessageLite._vptr_MessageLite =
             (MessageLite)&annotations._has_bits_;
        pp_Var14 = (_func_int **)(plVar11 + 2);
        if ((_func_int **)*plVar11 == pp_Var14) {
          annotations._16_8_ = *pp_Var14;
          annotations.annotation_.super_RepeatedPtrFieldBase.arena_ = (Arena *)plVar11[3];
        }
        else {
          annotations._16_8_ = *pp_Var14;
          annotations.super_Message.super_MessageLite._vptr_MessageLite =
               (MessageLite)(MessageLite)*plVar11;
        }
        annotations._internal_metadata_.
        super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
        .ptr_ = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 )plVar11[1];
        *plVar11 = (long)pp_Var14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        if ((pointer)local_120._0_8_ != (pointer)(local_120 + 0x10)) {
          operator_delete((void *)local_120._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_120._16_8_)->_M_p + 1));
        }
        if (generator.descriptor_ !=
            (EnumDescriptor *)
            &generator.canonical_values_.
             super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
          operator_delete(generator.descriptor_,
                          (long)generator.canonical_values_.
                                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(file_list,(value_type *)&annotations);
        filename._M_dataplus._M_p = (pointer)&filename.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&filename,annotations.super_Message.super_MessageLite._vptr_MessageLite
                   ,(long)annotations._internal_metadata_.
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_ +
                    (long)annotations.super_Message.super_MessageLite._vptr_MessageLite);
        std::__cxx11::string::append((char *)&filename);
        GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)&generator);
        annotation_collector_2.super_AnnotationCollector._vptr_AnnotationCollector =
             (_func_int **)&PTR_AddAnnotation_0041fe08;
        annotation_collector_2.annotation_proto_ = (GeneratedCodeInfo *)&generator;
        iVar5 = (*context->_vptr_GeneratorContext[2])(context,&annotations);
        pZVar7 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_04,iVar5);
        pAVar15 = (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)0x0;
        if (bVar1 != false) {
          pAVar15 = &annotation_collector_2;
        }
        io::Printer::Printer((Printer *)local_120,pZVar7,'$',&pAVar15->super_AnnotationCollector);
        io::Printer::Print((Printer *)local_120,
                           "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                           ,"filename",(string *)**(undefined8 **)(lVar3 + 0x10 + lVar16));
        if ((this->java_package_)._M_string_length != 0) {
          io::Printer::Print((Printer *)local_120,"package $package$;\n\n","package",
                             &this->java_package_);
        }
        (**(code **)(*plVar6 + 0x10))(plVar6,(Printer *)local_120);
        if (bVar1 != false) {
          iVar5 = (*context->_vptr_GeneratorContext[2])(context,&filename);
          pZVar8 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_05,iVar5);
          MessageLite::SerializeToZeroCopyStream((MessageLite *)&generator,pZVar8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(annotation_list,&filename);
          if (pZVar8 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar8->_vptr_ZeroCopyOutputStream[1])(pZVar8);
          }
        }
        io::Printer::~Printer((Printer *)local_120);
        if (pZVar7 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar7->_vptr_ZeroCopyOutputStream[1])(pZVar7);
        }
        GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)&generator);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)filename._M_dataplus._M_p != &filename.field_2) {
          operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
        }
        if (annotations.super_Message.super_MessageLite._vptr_MessageLite !=
            (MessageLite)&annotations._has_bits_) {
          operator_delete((void *)annotations.super_Message.super_MessageLite._vptr_MessageLite,
                          annotations._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)info_full_path._M_dataplus._M_p != &info_full_path.field_2) {
          operator_delete(info_full_path._M_dataplus._M_p,
                          CONCAT71(info_full_path.field_2._M_allocated_capacity._1_7_,
                                   info_full_path.field_2._M_local_buf[0]) + 1);
        }
        (**(code **)(*plVar6 + 8))(plVar6);
        lVar17 = lVar17 + 1;
        pFVar10 = this->file_;
        lVar16 = lVar16 + 0x30;
      } while (lVar17 < *(int *)(pFVar10 + 0x78));
    }
  }
  return;
}

Assistant:

void FileGenerator::GenerateSiblings(const string& package_dir,
                                     GeneratorContext* context,
                                     std::vector<string>* file_list,
                                     std::vector<string>* annotation_list) {
  if (MultipleJavaFiles(file_, immutable_api_)) {
    for (int i = 0; i < file_->enum_type_count(); i++) {
      if (HasDescriptorMethods(file_, context_->EnforceLite())) {
        EnumGenerator generator(file_->enum_type(i), immutable_api_,
                                context_.get());
        GenerateSibling<EnumGenerator>(
            package_dir, java_package_, file_->enum_type(i), context, file_list,
            options_.annotate_code, annotation_list, "", &generator,
            &EnumGenerator::Generate);
      } else {
        EnumLiteGenerator generator(file_->enum_type(i), immutable_api_,
                                    context_.get());
        GenerateSibling<EnumLiteGenerator>(
            package_dir, java_package_, file_->enum_type(i), context, file_list,
            options_.annotate_code, annotation_list, "", &generator,
            &EnumLiteGenerator::Generate);
      }
    }
    for (int i = 0; i < file_->message_type_count(); i++) {
      if (immutable_api_) {
        GenerateSibling<MessageGenerator>(
            package_dir, java_package_, file_->message_type(i), context,
            file_list, options_.annotate_code, annotation_list, "OrBuilder",
            message_generators_[i].get(), &MessageGenerator::GenerateInterface);
      }
      GenerateSibling<MessageGenerator>(
          package_dir, java_package_, file_->message_type(i), context,
          file_list, options_.annotate_code, annotation_list, "",
          message_generators_[i].get(), &MessageGenerator::Generate);
    }
    if (HasGenericServices(file_, context_->EnforceLite())) {
      for (int i = 0; i < file_->service_count(); i++) {
        google::protobuf::scoped_ptr<ServiceGenerator> generator(
            generator_factory_->NewServiceGenerator(file_->service(i)));
        GenerateSibling<ServiceGenerator>(
            package_dir, java_package_, file_->service(i), context, file_list,
            options_.annotate_code, annotation_list, "", generator.get(),
            &ServiceGenerator::Generate);
      }
    }
  }
}